

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O1

dgEdge * __thiscall
dgPolyhedra::FindEarTip
          (dgPolyhedra *this,dgEdge *face,HaF64 *pool,HaI32 stride,
          dgDownHeap<dgEdge_*,_double> *heap,dgBigVector *normal)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  dgPolyhedra *pdVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  dgTreeNode *pdVar15;
  HaF64 HVar16;
  ulong uVar17;
  HaF64 HVar18;
  long lVar19;
  dgEdge *pdVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  double dVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  double dVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double dVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  dgEdge *ptr;
  dgEdge *local_98;
  dgDownHeap<dgEdge_*,_double> *local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  dgPolyhedra *local_48;
  double local_40;
  double local_38;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  lVar19 = (long)stride;
  lVar11 = face->m_prev->m_incidentVertex * lVar19;
  dVar49 = (double)pool[lVar11 + 1];
  dVar1 = (double)pool[lVar11 + 2];
  local_98 = face;
  local_90 = heap;
  if (((((ulong)ABS((double)pool[lVar11]) < 0x7ff0000000000000) &&
       ((ulong)ABS(dVar49) < 0x7ff0000000000000)) && (!NAN(dVar49))) &&
     (((ulong)ABS(dVar1) < 0x7ff0000000000000 && (!NAN(dVar1))))) {
    lVar12 = face->m_incidentVertex * lVar19;
    dVar43 = (double)pool[lVar12];
    dVar46 = (double)pool[lVar12 + 1];
    dVar52 = (double)pool[lVar12 + 2];
    if (((((ulong)ABS(dVar43) < 0x7ff0000000000000) &&
         (((ulong)ABS(dVar46) < 0x7ff0000000000000 && (!NAN(dVar46))))) &&
        ((ulong)ABS(dVar52) < 0x7ff0000000000000)) && (!NAN(dVar52))) {
      dVar9 = dVar43 - (double)pool[lVar11];
      dVar49 = dVar46 - dVar49;
      dVar1 = dVar52 - dVar1;
      if ((((long)ABS(dVar9) < 0x7ff0000000000000) && ((long)ABS(dVar49) < 0x7ff0000000000000)) &&
         ((long)ABS(dVar1) < 0x7ff0000000000000)) {
        auVar22._8_8_ = 0;
        auVar22._0_8_ = dVar49 * dVar49;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = dVar9;
        auVar22 = vfmadd231sd_fma(auVar22,auVar29,auVar29);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = dVar1;
        auVar22 = vfmadd231sd_fma(auVar22,auVar23,auVar23);
        if (auVar22._0_8_ < 0.0) {
          local_88 = dVar1;
          local_80 = dVar49;
          local_78 = dVar9;
          local_70 = dVar52;
          local_68 = dVar46;
          local_60 = dVar43;
          auVar34._0_8_ = sqrt(auVar22._0_8_);
          auVar34._8_56_ = extraout_var;
          auVar22 = auVar34._0_16_;
          dVar49 = local_80;
          dVar1 = local_88;
          dVar9 = local_78;
          dVar43 = local_60;
          dVar46 = local_68;
          dVar52 = local_70;
        }
        else {
          auVar22 = vsqrtsd_avx(auVar22,auVar22);
        }
        auVar22 = vmaxsd_avx(ZEXT816(0x3ddb7cdfe0000000),auVar22);
        dVar31 = 1.0 / auVar22._0_8_;
        dVar9 = dVar9 * dVar31;
        dVar49 = dVar49 * dVar31;
        dVar1 = dVar1 * dVar31;
        local_48 = this;
        if ((((long)ABS(dVar9) < 0x7ff0000000000000) && ((long)ABS(dVar49) < 0x7ff0000000000000)) &&
           ((long)ABS(dVar1) < 0x7ff0000000000000)) {
          auVar30 = ZEXT816(0x4024000000000000);
          do {
            lVar11 = local_98->m_next->m_incidentVertex * lVar19;
            dVar31 = (double)pool[lVar11];
            dVar2 = (double)pool[lVar11 + 1];
            dVar3 = (double)pool[lVar11 + 2];
            if (((0x7fefffffffffffff < (ulong)ABS(dVar31)) ||
                (0x7fefffffffffffff < (ulong)ABS(dVar2))) ||
               ((NAN(dVar2) || ((0x7fefffffffffffff < (ulong)ABS(dVar3) || (NAN(dVar3)))))))
            goto LAB_0087ea61;
            dVar43 = dVar31 - dVar43;
            dVar46 = dVar2 - dVar46;
            dVar52 = dVar3 - dVar52;
            if ((0x7fefffffffffffff < (long)ABS(dVar43)) ||
               ((0x7fefffffffffffff < (long)ABS(dVar46) || (0x7fefffffffffffff < (long)ABS(dVar52)))
               )) goto LAB_0087ea42;
            auVar24._8_8_ = 0;
            auVar24._0_8_ = dVar46 * dVar46;
            auVar25._8_8_ = 0;
            auVar25._0_8_ = dVar43;
            auVar22 = vfmadd231sd_fma(auVar24,auVar25,auVar25);
            auVar26._8_8_ = 0;
            auVar26._0_8_ = dVar52;
            auVar22 = vfmadd231sd_fma(auVar22,auVar26,auVar26);
            local_60 = auVar30._0_8_;
            local_78 = dVar3;
            local_70 = dVar2;
            local_68 = dVar31;
            if (auVar22._0_8_ < 0.0) {
              local_88 = dVar49;
              local_80 = dVar9;
              local_58 = dVar43;
              local_50 = dVar1;
              local_40 = dVar52;
              local_38 = dVar46;
              auVar35._0_8_ = sqrt(auVar22._0_8_);
              auVar35._8_56_ = extraout_var_00;
              auVar22 = auVar35._0_16_;
              auVar30._8_8_ = 0;
              auVar30._0_8_ = local_60;
              dVar43 = local_58;
              dVar46 = local_38;
              dVar52 = local_40;
              dVar9 = local_80;
              dVar49 = local_88;
              dVar1 = local_50;
            }
            else {
              auVar22 = vsqrtsd_avx(auVar22,auVar22);
            }
            auVar27._0_4_ = (float)auVar22._0_8_;
            auVar27._4_12_ = auVar22._4_12_;
            auVar22 = vmaxss_avx(SUB6416(ZEXT464(0x2edbe6ff),0),auVar27);
            dVar31 = (double)(1.0 / auVar22._0_4_);
            dVar43 = dVar43 * dVar31;
            dVar46 = dVar46 * dVar31;
            dVar52 = dVar52 * dVar31;
            if (((0x7fefffffffffffff < (long)ABS(dVar43)) ||
                (0x7fefffffffffffff < (long)ABS(dVar46))) ||
               (0x7fefffffffffffff < (long)ABS(dVar52))) goto LAB_0087ea42;
            auVar50._8_8_ = 0;
            auVar50._0_8_ = dVar49;
            auVar53._8_8_ = 0;
            auVar53._0_8_ = dVar52;
            auVar60._8_8_ = 0;
            auVar60._0_8_ = dVar1 * dVar46;
            auVar22 = vfmsub231sd_fma(auVar60,auVar50,auVar53);
            auVar36._8_8_ = 0;
            auVar36._0_8_ = dVar52 * dVar9;
            auVar44._8_8_ = 0;
            auVar44._0_8_ = dVar43;
            auVar55._8_8_ = 0;
            auVar55._0_8_ = dVar1;
            auVar23 = vfmsub231sd_fma(auVar36,auVar44,auVar55);
            auVar28._8_8_ = 0;
            auVar28._0_8_ = dVar43 * dVar49;
            auVar41._8_8_ = 0;
            auVar41._0_8_ = dVar9;
            auVar47._8_8_ = 0;
            auVar47._0_8_ = dVar46;
            auVar29 = vfmsub231sd_fma(auVar28,auVar47,auVar41);
            if (((0x7fefffffffffffff < (auVar22._0_8_ & 0x7fffffffffffffff)) ||
                (0x7fefffffffffffff < (ulong)ABS(auVar23._0_8_))) ||
               (0x7fefffffffffffff < (auVar29._0_8_ & 0x7fffffffffffffff))) goto LAB_0087ea42;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = (normal->super_dgTemplateVector<double>).m_x;
            auVar37._8_8_ = 0;
            auVar37._0_8_ = auVar23._0_8_ * (normal->super_dgTemplateVector<double>).m_y;
            auVar22 = vfmadd132sd_fma(auVar22,auVar37,auVar7);
            auVar8._8_8_ = 0;
            auVar8._0_8_ = (normal->super_dgTemplateVector<double>).m_z;
            auVar32 = vfmadd132sd_fma(auVar29,auVar22,auVar8);
            dVar31 = auVar32._0_8_;
            dVar9 = dVar43;
            dVar49 = dVar46;
            dVar1 = dVar52;
            if (0.0 <= dVar31) {
              local_88 = dVar46;
              local_80 = dVar43;
              local_58 = dVar31;
              local_50 = dVar52;
              dgDownHeap<dgEdge_*,_double>::Push(local_90,&local_98,dVar31);
              auVar32._8_8_ = 0;
              auVar32._0_8_ = local_58;
              auVar30._8_8_ = 0;
              auVar30._0_8_ = local_60;
              dVar9 = local_80;
              dVar49 = local_88;
              dVar1 = local_50;
            }
            pdVar10 = local_48;
            auVar30 = vminsd_avx(auVar32,auVar30);
            local_98 = local_98->m_next;
            dVar43 = local_68;
            dVar46 = local_70;
            dVar52 = local_78;
          } while (local_98 != face);
          iVar14 = (local_90->super_dgHeapBase<dgEdge_*,_double>).m_curCount;
          if (auVar30._0_8_ <= 0.10000000149011612) {
            if (iVar14 != 0) {
              if (-1 < iVar14) {
LAB_0087e589:
                pdVar20 = *(dgEdge **)((local_90->super_dgHeapBase<dgEdge_*,_double>).m_pool + 8);
                dgDownHeap<dgEdge_*,_double>::Pop(local_90);
                lVar11 = (long)pdVar20->m_prev->m_incidentVertex;
                uVar13 = (ulong)pdVar20->m_next->m_incidentVertex;
                pdVar15 = (pdVar10->super_dgTree<dgEdge,_long>).m_head;
                if (pdVar15 != (dgTreeNode *)0x0) {
                  uVar17 = lVar11 << 0x20 | uVar13;
                  do {
                    lVar12 = 8;
                    if ((pdVar15->m_key <= (long)uVar17) &&
                       (lVar12 = 0x10, (long)uVar17 <= pdVar15->m_key)) {
                      iVar14 = (local_90->super_dgHeapBase<dgEdge_*,_double>).m_curCount;
                      if (iVar14 == 0) {
                        return pdVar20;
                      }
                      goto LAB_0087ea06;
                    }
                    pdVar15 = *(dgTreeNode **)
                               ((long)&(pdVar15->super_dgRedBackNode)._vptr_dgRedBackNode + lVar12);
                  } while (pdVar15 != (dgTreeNode *)0x0);
                }
                lVar11 = lVar11 * lVar19;
                dVar49 = (double)pool[lVar11];
                dVar1 = (double)pool[lVar11 + 1];
                dVar52 = (double)pool[lVar11 + 2];
                if (((((ulong)ABS(dVar49) < 0x7ff0000000000000) &&
                     ((ulong)ABS(dVar1) < 0x7ff0000000000000)) && (!NAN(dVar1))) &&
                   (((ulong)ABS(dVar52) < 0x7ff0000000000000 && (!NAN(dVar52))))) {
                  lVar11 = pdVar20->m_incidentVertex * lVar19;
                  dVar43 = (double)pool[lVar11];
                  dVar46 = (double)pool[lVar11 + 1];
                  dVar9 = (double)pool[lVar11 + 2];
                  if ((((ulong)ABS(dVar43) < 0x7ff0000000000000) &&
                      (((ulong)ABS(dVar46) < 0x7ff0000000000000 && (!NAN(dVar46))))) &&
                     (((ulong)ABS(dVar9) < 0x7ff0000000000000 && (!NAN(dVar9))))) {
                    lVar11 = uVar13 * lVar19;
                    dVar31 = (double)pool[lVar11];
                    dVar2 = (double)pool[lVar11 + 1];
                    dVar3 = (double)pool[lVar11 + 2];
                    if (((((ulong)ABS(dVar31) < 0x7ff0000000000000) &&
                         ((ulong)ABS(dVar2) < 0x7ff0000000000000)) && (!NAN(dVar2))) &&
                       (((ulong)ABS(dVar3) < 0x7ff0000000000000 && (!NAN(dVar3))))) {
                      if (((long)ABS(dVar43 - dVar49) < 0x7ff0000000000000) &&
                         (((long)ABS(dVar46 - dVar1) < 0x7ff0000000000000 &&
                          ((long)ABS(dVar9 - dVar52) < 0x7ff0000000000000)))) {
                        if (((long)ABS(dVar31 - dVar43) < 0x7ff0000000000000) &&
                           (((long)ABS(dVar2 - dVar46) < 0x7ff0000000000000 &&
                            ((long)ABS(dVar3 - dVar9) < 0x7ff0000000000000)))) {
                          auVar38._8_8_ = 0;
                          auVar38._0_8_ = dVar1;
                          auVar51._8_8_ = 0;
                          auVar51._0_8_ = dVar2;
                          auVar22 = vsubsd_avx512f(auVar38,auVar51);
                          auVar39._8_8_ = 0;
                          auVar39._0_8_ = dVar52;
                          auVar54._8_8_ = 0;
                          auVar54._0_8_ = dVar3;
                          auVar23 = vsubsd_avx512f(auVar39,auVar54);
                          if (((long)ABS(dVar49 - dVar31) < 0x7ff0000000000000) &&
                             (((auVar22._0_8_ & 0x7fffffffffffffff) < 0x7ff0000000000000 &&
                              ((auVar23._0_8_ & 0x7fffffffffffffff) < 0x7ff0000000000000)))) {
                            local_98 = pdVar20->m_next->m_next;
                            bVar21 = local_98 == pdVar20->m_prev;
                            if (bVar21) {
                              return pdVar20;
                            }
                            dVar4 = (normal->super_dgTemplateVector<double>).m_x;
                            dVar5 = (normal->super_dgTemplateVector<double>).m_y;
                            dVar6 = (normal->super_dgTemplateVector<double>).m_z;
                            do {
                              lVar11 = local_98->m_incidentVertex * lVar19;
                              HVar18 = (HaF64)ABS((double)pool[lVar11 + 1]);
                              HVar16 = (HaF64)ABS((double)pool[lVar11 + 2]);
                              if (((0x7fefffffffffffff < (ulong)ABS((double)pool[lVar11])) ||
                                  (0x7fefffffffffffff < (ulong)HVar18)) ||
                                 (auVar71._8_8_ = 0, auVar71._0_8_ = pool[lVar11 + 1],
                                 auVar29 = vucomisd_avx512f(auVar71),
                                 (ulong)HVar18 < 0x7ff0000000000000)) goto LAB_0087ea61;
                              if ((0x7fefffffffffffff < (ulong)HVar16) ||
                                 (auVar72._8_8_ = 0, auVar72._0_8_ = pool[lVar11 + 2],
                                 auVar30 = vucomisd_avx512f(auVar72),
                                 (ulong)HVar16 < 0x7ff0000000000000)) goto LAB_0087ea61;
                              auVar33._8_8_ = 0;
                              auVar33._0_8_ = dVar49;
                              auVar70._8_8_ = 0;
                              auVar70._0_8_ = pool[lVar11];
                              auVar24 = vsubsd_avx512f(auVar70,auVar33);
                              auVar25 = vsubsd_avx512f(auVar29,auVar38);
                              auVar26 = vsubsd_avx512f(auVar30,auVar39);
                              auVar57._8_8_ = 0;
                              auVar57._0_8_ = dVar46 - dVar1;
                              auVar27 = vmulsd_avx512f(auVar57,auVar26);
                              auVar58._8_8_ = 0;
                              auVar58._0_8_ = dVar9 - dVar52;
                              auVar27 = vfmsub231sd_avx512f(auVar27,auVar25,auVar58);
                              auVar28 = vmulsd_avx512f(auVar58,auVar24);
                              auVar56._8_8_ = 0;
                              auVar56._0_8_ = dVar43 - dVar49;
                              auVar26 = vfmsub231sd_avx512f(auVar28,auVar56,auVar26);
                              auVar25 = vmulsd_avx512f(auVar56,auVar25);
                              auVar24 = vfmsub231sd_avx512f(auVar25,auVar57,auVar24);
                              auVar66._8_8_ = 0;
                              auVar66._0_8_ = dVar5;
                              auVar25 = vmulsd_avx512f(auVar26,auVar66);
                              auVar64._8_8_ = 0;
                              auVar64._0_8_ = dVar4;
                              auVar25 = vfmadd231sd_avx512f(auVar25,auVar64,auVar27);
                              auVar68._8_8_ = 0;
                              auVar68._0_8_ = dVar6;
                              auVar24 = vfmadd231sd_avx512f(auVar25,auVar68,auVar24);
                              vucomisd_avx512f(auVar24);
                              if (0x7fefffffffffffff < (ulong)HVar16) {
                                auVar40._8_8_ = 0;
                                auVar40._0_8_ = dVar43;
                                auVar24 = vsubsd_avx512f(auVar70,auVar40);
                                auVar42._8_8_ = 0;
                                auVar42._0_8_ = dVar46;
                                auVar25 = vsubsd_avx512f(auVar29,auVar42);
                                auVar45._8_8_ = 0;
                                auVar45._0_8_ = dVar9;
                                auVar26 = vsubsd_avx512f(auVar30,auVar45);
                                auVar61._8_8_ = 0;
                                auVar61._0_8_ = dVar2 - dVar46;
                                auVar27 = vmulsd_avx512f(auVar61,auVar26);
                                auVar62._8_8_ = 0;
                                auVar62._0_8_ = dVar3 - dVar9;
                                auVar27 = vfmsub231sd_avx512f(auVar27,auVar25,auVar62);
                                auVar28 = vmulsd_avx512f(auVar62,auVar24);
                                auVar59._8_8_ = 0;
                                auVar59._0_8_ = dVar31 - dVar43;
                                auVar26 = vfmsub231sd_avx512f(auVar28,auVar59,auVar26);
                                auVar25 = vmulsd_avx512f(auVar59,auVar25);
                                auVar24 = vfmsub231sd_avx512f(auVar25,auVar61,auVar24);
                                auVar25 = vmulsd_avx512f(auVar26,auVar66);
                                auVar25 = vfmadd231sd_avx512f(auVar25,auVar64,auVar27);
                                auVar24 = vfmadd231sd_avx512f(auVar25,auVar68,auVar24);
                                vucomisd_avx512f(auVar24);
                                if (0x7fefffffffffffff < (ulong)HVar16) {
                                  auVar48._8_8_ = 0;
                                  auVar48._0_8_ = dVar31;
                                  auVar24 = vsubsd_avx512f(auVar70,auVar48);
                                  auVar29 = vsubsd_avx512f(auVar29,auVar51);
                                  auVar30 = vsubsd_avx512f(auVar30,auVar54);
                                  auVar25 = vmulsd_avx512f(auVar22,auVar30);
                                  auVar25 = vfmsub231sd_avx512f(auVar25,auVar29,auVar23);
                                  auVar26 = vmulsd_avx512f(auVar23,auVar24);
                                  auVar63._8_8_ = 0;
                                  auVar63._0_8_ = dVar49 - dVar31;
                                  auVar30 = vfmsub231sd_avx512f(auVar26,auVar63,auVar30);
                                  auVar29 = vmulsd_avx512f(auVar63,auVar29);
                                  auVar29 = vfmsub231sd_avx512f(auVar29,auVar22,auVar24);
                                  auVar67._8_8_ = 0;
                                  auVar67._0_8_ = dVar5;
                                  auVar30 = vmulsd_avx512f(auVar30,auVar67);
                                  auVar65._8_8_ = 0;
                                  auVar65._0_8_ = dVar4;
                                  auVar30 = vfmadd231sd_avx512f(auVar30,auVar65,auVar25);
                                  auVar69._8_8_ = 0;
                                  auVar69._0_8_ = dVar6;
                                  auVar29 = vfmadd231sd_avx512f(auVar30,auVar69,auVar29);
                                  vucomisd_avx512f(auVar29);
                                  if (0x7fefffffffffffff < (ulong)HVar16) goto LAB_0087e9f4;
                                }
                              }
                              local_98 = local_98->m_next;
                              bVar21 = local_98 == pdVar20->m_prev;
                              if (bVar21) {
                                return pdVar20;
                              }
                            } while( true );
                          }
                        }
                      }
                      goto LAB_0087ea42;
                    }
                  }
                }
                goto LAB_0087ea61;
              }
              goto LAB_0087ea0e;
            }
            pdVar20 = (dgEdge *)0x0;
          }
          else {
            if (iVar14 < 0) {
LAB_0087ea0e:
              __assert_fail("i<= m_curCount",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgHeap.h"
                            ,0xcd,
                            "const OBJECT &dgHeapBase<dgEdge *, double>::operator[](hacd::HaI32) const [OBJECT = dgEdge *, KEY = double]"
                           );
            }
            pdVar20 = *(dgEdge **)((local_90->super_dgHeapBase<dgEdge_*,_double>).m_pool + 8);
          }
          return pdVar20;
        }
      }
LAB_0087ea42:
      __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                    ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
    }
  }
LAB_0087ea61:
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x152,"dgBigVector::dgBigVector(const hacd::HaF64 *)");
LAB_0087e9f4:
  iVar14 = (local_90->super_dgHeapBase<dgEdge_*,_double>).m_curCount;
  if (bVar21 || iVar14 == 0) {
    return pdVar20;
  }
LAB_0087ea06:
  if (iVar14 < 0) goto LAB_0087ea0e;
  goto LAB_0087e589;
}

Assistant:

dgEdge* dgPolyhedra::FindEarTip (dgEdge* const face, const hacd::HaF64* const pool, hacd::HaI32 stride, dgDownHeap<dgEdge*, hacd::HaF64>& heap, const dgBigVector &normal) const
{
	dgEdge* ptr = face;
	dgBigVector p0 (&pool[ptr->m_prev->m_incidentVertex * stride]);
	dgBigVector p1 (&pool[ptr->m_incidentVertex * stride]);
	dgBigVector d0 (p1 - p0);
	hacd::HaF64 f = sqrt (d0 % d0);
	if (f < hacd::HaF64 (1.0e-10f)) {
		f = hacd::HaF64 (1.0e-10f);
	}
	d0 = d0.Scale (hacd::HaF64 (1.0f) / f);

	hacd::HaF64 minAngle = hacd::HaF32 (10.0f);
	do {
		dgBigVector p2 (&pool [ptr->m_next->m_incidentVertex * stride]);
		dgBigVector d1 (p2 - p1);
		hacd::HaF32 f = dgSqrt (d1 % d1);
		if (f < hacd::HaF32 (1.0e-10f)) {
			f = hacd::HaF32 (1.0e-10f);
		}
		d1 = d1.Scale (hacd::HaF32 (1.0f) / f);
		dgBigVector n (d0 * d1);

		hacd::HaF64 angle = normal %  n;
		if (angle >= hacd::HaF64 (0.0f)) {
			heap.Push (ptr, angle);
		}

		if (angle < minAngle) {
			minAngle = angle;
		}

		d0 = d1;
		p1 = p2;
		ptr = ptr->m_next;
	} while (ptr != face);

	if (minAngle > hacd::HaF32 (0.1f)) {
		return heap[0];
	}

	dgEdge* ear = NULL;
	while (heap.GetCount()) {
		ear = heap[0];
		heap.Pop();

		if (FindEdge (ear->m_prev->m_incidentVertex, ear->m_next->m_incidentVertex)) {
			continue;
		}

		dgBigVector p0 (&pool [ear->m_prev->m_incidentVertex * stride]);
		dgBigVector p1 (&pool [ear->m_incidentVertex * stride]);
		dgBigVector p2 (&pool [ear->m_next->m_incidentVertex * stride]);

		dgBigVector p10 (p1 - p0);
		dgBigVector p21 (p2 - p1);
		dgBigVector p02 (p0 - p2);

		for (ptr = ear->m_next->m_next; ptr != ear->m_prev; ptr = ptr->m_next) {
			dgBigVector p (&pool [ptr->m_incidentVertex * stride]);

			hacd::HaF64 side = ((p - p0) * p10) % normal;
			if (side < hacd::HaF64 (0.05f)) {
				side = ((p - p1) * p21) % normal;
				if (side < hacd::HaF64 (0.05f)) {
					side = ((p - p2) * p02) % normal;
					if (side < hacd::HaF32 (0.05f)) {
						break;
					}
				}
			}
		}

		if (ptr == ear->m_prev) {
			break;
		}
	}

	return ear;
}